

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O1

Literals * __thiscall
wasm::ShellExternalInterface::callTable
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type results,ModuleRunner *instance)

{
  char **this_00;
  Module *pMVar1;
  IString name;
  Literals *__return_storage_ptr___00;
  bool bVar2;
  char cVar3;
  __node_base_ptr p_Var4;
  ulong uVar5;
  IString *pIVar6;
  size_t sVar7;
  Type *pTVar8;
  uintptr_t *puVar9;
  array<wasm::Literal,_1UL> *paVar10;
  uintptr_t extraout_RDX;
  long lVar11;
  _Hash_node_base *p_Var12;
  long lVar13;
  Name NVar14;
  undefined1 local_b0 [8];
  Name tableName_local;
  Literal local_98;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_80;
  Type local_68;
  Literals *local_60;
  IString *local_58;
  char **local_50;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_b0 = tableName.super_IString.str._M_len;
  p_Var12 = (_Hash_node_base *)0x0;
  local_60 = __return_storage_ptr__;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = (size_t)this;
  p_Var4 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->tables)._M_h,
                      tableName_local.super_IString.str._M_len % (this->tables)._M_h._M_bucket_count
                      ,(key_type *)local_b0,tableName_local.super_IString.str._M_len);
  if (p_Var4 != (__node_base_ptr)0x0) {
    p_Var12 = p_Var4->_M_nxt;
  }
  if (p_Var12 == (_Hash_node_base *)0x0) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callTable on non-existing table");
  }
  uVar5 = ((long)p_Var12[4]._M_nxt - (long)p_Var12[3]._M_nxt >> 3) * -0x5555555555555555;
  if (uVar5 < index.addr || uVar5 - index.addr == 0) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callTable overflow");
  }
  bVar2 = Type::isFunction((Type *)(p_Var12[3]._M_nxt + index.addr * 3 + 2));
  if (bVar2) {
    bVar2 = Type::isNull((Type *)(p_Var12[3]._M_nxt + index.addr * 3 + 2));
    if (!bVar2) {
      pMVar1 = (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
      NVar14 = Literal::getFunc((Literal *)(p_Var12[3]._M_nxt + index.addr * 3));
      NVar14.super_IString.str._M_str = NVar14.super_IString.str._M_len;
      NVar14.super_IString.str._M_len = (size_t)pMVar1;
      pIVar6 = (IString *)wasm::Module::getFunctionOrNull(NVar14);
      goto LAB_00125a50;
    }
  }
  pIVar6 = (IString *)0x0;
LAB_00125a50:
  if (pIVar6 == (IString *)0x0) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "uninitialized table element");
  }
  if (*(char **)((long)(pIVar6 + 3) + 8) != (char *)sig.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: function types don\'t match");
  }
  local_58 = pIVar6;
  local_48 = (undefined1  [8])wasm::HeapType::getSignature();
  sVar7 = Type::size((Type *)local_48);
  if (sVar7 != ((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
               (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad # of arguments");
  }
  local_50 = (char **)((long)(pIVar6 + 3) + 8);
  local_68.id = wasm::HeapType::getSignature();
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_48 = (undefined1  [8])&local_68;
  pTVar8 = (Type *)Type::size(&local_68);
  if ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent != pTVar8
      ) || (local_48 != (undefined1  [8])&local_68)) {
    lVar13 = -0x18;
    lVar11 = 0;
    do {
      puVar9 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_48);
      bVar2 = lVar11 == 0;
      lVar11 = lVar11 + -1;
      paVar10 = (array<wasm::Literal,_1UL> *)
                ((long)&((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start)->field_0 + lVar13);
      if (bVar2) {
        paVar10 = &(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed;
      }
      cVar3 = wasm::Type::isSubType((Type)paVar10->_M_elems[0].type.id,(Type)*puVar9);
      if (cVar3 == '\0') {
        (**(code **)(*(long *)__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index + 0x40))
                  (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"callIndirect: bad argument type");
      }
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
      lVar13 = lVar13 + 0x18;
    } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar8) || (local_48 != (undefined1  [8])&local_68));
  }
  wasm::HeapType::getSignature();
  if (extraout_RDX != results.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad result type");
  }
  __return_storage_ptr___00 = local_60;
  if (*(long *)&local_58[2].str == 0) {
    name.str = local_58->str;
    this_00 = &tableName_local.super_IString.str._M_str;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)this_00,
               &arguments->super_SmallVector<wasm::Literal,_1UL>);
    ModuleRunnerBase<wasm::ModuleRunner>::callFunction
              (__return_storage_ptr___00,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,
               (Name)name.str,(Literals *)this_00);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_80);
    wasm::Literal::~Literal(&local_98);
  }
  else {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x20))
              (local_60,__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index,local_58,arguments);
  }
  return __return_storage_ptr___00;
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type results,
                     ModuleRunner& instance) override {

    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("callTable on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("callTable overflow");
    }
    Function* func = nullptr;
    if (table[index].isFunction() && !table[index].isNull()) {
      func = instance.wasm.getFunctionOrNull(table[index].getFunc());
    }
    if (!func) {
      trap("uninitialized table element");
    }
    if (sig != func->type) {
      trap("callIndirect: function types don't match");
    }
    if (func->getParams().size() != arguments.size()) {
      trap("callIndirect: bad # of arguments");
    }
    size_t i = 0;
    for (const auto& param : func->getParams()) {
      if (!Type::isSubType(arguments[i++].type, param)) {
        trap("callIndirect: bad argument type");
      }
    }
    if (func->getResults() != results) {
      trap("callIndirect: bad result type");
    }
    if (func->imported()) {
      return callImport(func, arguments);
    } else {
      return instance.callFunction(func->name, arguments);
    }
  }